

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O2

int __thiscall
cbtDbvt::clone(cbtDbvt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  cbtDbvtNode *pcVar1;
  cbtDbvtNode *parent;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  cbtDbvtNode *pcVar5;
  cbtDbvtNode **ppcVar6;
  int iVar7;
  cbtAlignedObjectArray<cbtDbvt::sStkCLN> stack;
  sStkCLN local_68;
  long *local_58;
  cbtAlignedObjectArray<cbtDbvt::sStkCLN> local_50;
  
  local_58 = (long *)__child_stack;
  clear((cbtDbvt *)__fn);
  iVar7 = extraout_EAX;
  if (this->m_root != (cbtDbvtNode *)0x0) {
    local_50.m_ownsMemory = true;
    local_50.m_data = (sStkCLN *)0x0;
    local_50.m_size = 0;
    local_50.m_capacity = 0;
    cbtAlignedObjectArray<cbtDbvt::sStkCLN>::reserve(&local_50,this->m_leaves);
    local_68.node = this->m_root;
    local_68.parent = (cbtDbvtNode *)0x0;
    cbtAlignedObjectArray<cbtDbvt::sStkCLN>::push_back(&local_50,&local_68);
    iVar7 = local_50.m_size;
    do {
      pcVar1 = local_50.m_data[(long)iVar7 + -1].node;
      parent = local_50.m_data[(long)iVar7 + -1].parent;
      pcVar5 = createnode((cbtDbvt *)__fn,parent,(pcVar1->field_2).data);
      uVar2 = *(undefined8 *)((pcVar1->volume).mi.m_floats + 2);
      uVar3 = *(undefined8 *)(pcVar1->volume).mx.m_floats;
      uVar4 = *(undefined8 *)((pcVar1->volume).mx.m_floats + 2);
      *(undefined8 *)(pcVar5->volume).mi.m_floats = *(undefined8 *)(pcVar1->volume).mi.m_floats;
      *(undefined8 *)((pcVar5->volume).mi.m_floats + 2) = uVar2;
      *(undefined8 *)(pcVar5->volume).mx.m_floats = uVar3;
      *(undefined8 *)((pcVar5->volume).mx.m_floats + 2) = uVar4;
      local_50.m_size = local_50.m_size + -1;
      ppcVar6 = (cbtDbvtNode **)((long)(&parent->volume + 1) + ((ulong)(iVar7 - 1U & 1) + 1) * 8);
      if (parent == (cbtDbvtNode *)0x0) {
        ppcVar6 = (cbtDbvtNode **)__fn;
      }
      *ppcVar6 = pcVar5;
      if ((pcVar1->field_2).childs[1] == (cbtDbvtNode *)0x0) {
        (**(code **)(*local_58 + 0x10))(local_58,pcVar5);
      }
      else {
        local_68.node = (pcVar1->field_2).childs[0];
        local_68.parent = pcVar5;
        cbtAlignedObjectArray<cbtDbvt::sStkCLN>::push_back(&local_50,&local_68);
        local_68.node = (pcVar1->field_2).childs[1];
        local_68.parent = pcVar5;
        cbtAlignedObjectArray<cbtDbvt::sStkCLN>::push_back(&local_50,&local_68);
      }
      iVar7 = local_50.m_size;
    } while (0 < local_50.m_size);
    cbtAlignedObjectArray<cbtDbvt::sStkCLN>::~cbtAlignedObjectArray(&local_50);
    iVar7 = extraout_EAX_00;
  }
  return iVar7;
}

Assistant:

void cbtDbvt::clone(cbtDbvt& dest, IClone* iclone) const
{
	dest.clear();
	if (m_root != 0)
	{
		cbtAlignedObjectArray<sStkCLN> stack;
		stack.reserve(m_leaves);
		stack.push_back(sStkCLN(m_root, 0));
		do
		{
			const int i = stack.size() - 1;
			const sStkCLN e = stack[i];
			cbtDbvtNode* n = createnode(&dest, e.parent, e.node->volume, e.node->data);
			stack.pop_back();
			if (e.parent != 0)
				e.parent->childs[i & 1] = n;
			else
				dest.m_root = n;
			if (e.node->isinternal())
			{
				stack.push_back(sStkCLN(e.node->childs[0], n));
				stack.push_back(sStkCLN(e.node->childs[1], n));
			}
			else
			{
				iclone->CloneLeaf(n);
			}
		} while (stack.size() > 0);
	}
}